

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

Variable resolve_var(Vm *vm,char *name,size_t length)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  Variable *pVVar4;
  VarHashTable *ht;
  long lVar5;
  VarHTItemKey key;
  undefined8 uStack_40;
  char acStack_38 [8];
  
  lVar3 = (long)(int)(vm->compiler).scope_depth;
  if (-1 < lVar3) {
    ht = (vm->compiler).scope + lVar3;
    lVar3 = lVar3 + 1;
    do {
      uStack_40 = 0x105a4f;
      key.ident_length = length;
      key.key_ident_string = name;
      pVVar4 = var_ht_get(ht,key);
      if (pVVar4 != (Variable *)0x0) {
        return *pVVar4;
      }
      ht = ht + -1;
      lVar5 = lVar3 + -1;
      bVar2 = 0 < lVar3;
      lVar3 = lVar5;
    } while (lVar5 != 0 && bVar2);
  }
  lVar3 = -(length + 0x31 & 0xfffffffffffffff0);
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x105a85;
  sprintf(acStack_38 + lVar3,"Could not find variable with name %.*s",length & 0xffffffff,name);
  uVar1 = (vm->compiler).scope[(ulong)((vm->compiler).previous.type != TOKEN_ERROR) * 2 + -8].cap;
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x105aac;
  printf("[Line %d] %s\n",(ulong)uVar1,acStack_38 + lVar3);
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x105abd;
  longjmp((__jmp_buf_tag *)error_buf,2);
}

Assistant:

static Variable resolve_var(Vm *vm, const char *name, size_t length) {
    Variable *variable = resolve_name(vm, name, length);

    if (variable != NULL) { return *variable; }

    char message[34 + length];
    sprintf(message, "Could not find variable with name %.*s", (int) length, name);
    error(&vm->compiler, message);

    // not reachable, but clang warnings are annoying
    Variable error;
    error.index = -1;
    error.frame_offset = -1;
    return error;
}